

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_filter_zstd.c
# Opt level: O0

void test_write_filter_zstd(void)

{
  undefined8 uVar1;
  int iVar2;
  wchar_t wVar3;
  void *buff_00;
  void *__s;
  archive *paVar4;
  char *pcVar5;
  la_ssize_t lVar6;
  la_int64_t lVar7;
  uint local_64;
  int r;
  int i;
  size_t used3;
  size_t used2;
  size_t used1;
  char path [16];
  size_t datasize;
  size_t buffsize;
  char *data;
  char *buff;
  archive *a;
  archive_entry *ae;
  
  buff_00 = malloc(2000000);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'(',(uint)(buff_00 != (void *)0x0),"NULL != (buff = malloc(buffsize))",
                   (void *)0x0);
  if (buff_00 != (void *)0x0) {
    path[8] = '\x10';
    path[9] = '\'';
    path[10] = '\0';
    path[0xb] = '\0';
    path[0xc] = '\0';
    path[0xd] = '\0';
    path[0xe] = '\0';
    path[0xf] = '\0';
    __s = malloc(10000);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                     ,L'-',(uint)(__s != (void *)0x0),"NULL != (data = malloc(datasize))",
                     (void *)0x0);
    if (__s == (void *)0x0) {
      free(buff_00);
    }
    else {
      memset(__s,0,path._8_8_);
      paVar4 = archive_write_new();
      assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'7',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                       (void *)0x0);
      iVar2 = archive_write_set_format_ustar(paVar4);
      assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                          ,L'8',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                          paVar4);
      iVar2 = archive_write_add_filter_zstd(paVar4);
      if (iVar2 == 0) {
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'B',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'C',0xe,"ARCHIVE_FILTER_ZSTD",(long)iVar2,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'D',"zstd","\"zstd\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&used2);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'E',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used1)",paVar4);
        iVar2 = archive_filter_code(paVar4,0);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'F',0xe,"ARCHIVE_FILTER_ZSTD",(long)iVar2,"archive_filter_code(a, 0)",
                            (void *)0x0);
        pcVar5 = archive_filter_name(paVar4,0);
        assertion_equal_string
                  ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                   ,L'G',"zstd","\"zstd\"",pcVar5,"archive_filter_name(a, 0)",(void *)0x0,L'\0');
        a = (archive *)archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'H',(uint)((archive_entry *)a != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype((archive_entry *)a,0x8000);
        archive_entry_set_size((archive_entry *)a,path._8_8_);
        for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
          snprintf((char *)&used1,0x10,"file%03d");
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'N',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4)
          ;
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'P',(uint)(uVar1 == lVar6),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
        }
        archive_entry_free((archive_entry *)a);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'S',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'T',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'V',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'W',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_zstd(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Z');
          test_skipping(
                       "Can\'t verify zstd writing by reading back; zstd reading not fully supported on this platform"
                       );
        }
        else {
          iVar2 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'^',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)",
                              paVar4);
          iVar2 = archive_read_open_memory(paVar4,buff_00,used2);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'`',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used1)",paVar4);
          for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
            snprintf((char *)&used1,0x10,"file%03d",(ulong)local_64);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'd',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",(void *)0x0);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'f',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'g',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'i',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'k',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'q',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'r',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L't',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'u',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"nonexistent-option","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'w',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"nonexistent-option\", \"0\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","abc");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'y',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"abc\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","25");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'{',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"25\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","9");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'}',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"9\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","7");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x82',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"7\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"threads","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x84',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"threads\", \"-1\")",paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"threads","4");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x86',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"threads\", \"4\")",paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"frame-per-file","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8a',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"frame-per-file\", \"\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8d',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x8f',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"-1\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x91',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"0\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x93',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1048576\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x95',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1k\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x97',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1kB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x99',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1M\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9b',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1MB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9d',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1G\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-out","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'\x9f',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-out\", \"1GB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¢',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¤',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"-1\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¦',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"0\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¨',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1048576\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ª',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1k\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¬',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1kB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'®',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1M\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'°',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1MB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'²',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1G\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"min-frame-in","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'´',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"min-frame-in\", \"1GB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'·',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¹',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"-1\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'»',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"0\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1023");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'½',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1023\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1024");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'¿',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1024\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Á',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1048576\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ã',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1k\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Å',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1kB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ç',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1M\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'É',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1MB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ë',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1G\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-in","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Í',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-in\", \"1GB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ð',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ò',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"-1\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","0");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ô',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"0\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1023");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ö',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1023\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1024");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ø',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1024\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1048576");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ú',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1048576\")"
                            ,paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1k");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ü',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1k\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1kB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Þ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1kB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1M");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'à',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1M\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1MB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'â',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1MB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1G");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ä',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1G\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"max-frame-out","1GB");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'æ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"max-frame-out\", \"1GB\")",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"long","23");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ê',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"long\", \"23\")",paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"long","-1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ì',-0x19,"ARCHIVE_FAILED",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"long\", \"-1\")",paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&used3);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'î',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
          snprintf((char *)&used1,0x10,"file%03d",(ulong)local_64);
          a = (archive *)archive_entry_new();
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ñ',(uint)((archive_entry *)a != (archive_entry *)0x0),
                           "(ae = archive_entry_new()) != NULL",(void *)0x0);
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          archive_entry_set_size((archive_entry *)a,path._8_8_);
          archive_entry_set_filetype((archive_entry *)a,0x8000);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'õ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4
                             );
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ö',(uint)(uVar1 == lVar6),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
          archive_entry_free((archive_entry *)a);
        }
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ù',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ú',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ü',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ý',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_zstd(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ā');
          test_skipping("zstd reading not fully supported on this platform");
        }
        else {
          iVar2 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ă',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)"
                              ,paVar4);
          iVar2 = archive_read_open_memory(paVar4,buff_00,used3);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ą',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used2)",paVar4);
          for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
            snprintf((char *)&used1,0x10,"file%03d");
            failure("Trying to read %s",&used1);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'Ċ',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'Č',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'č',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ď',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'đ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ė',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ė',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_set_bytes_per_block(paVar4,10);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ę',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_bytes_per_block(a, 10)",paVar4);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ě',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_set_filter_option(paVar4,(char *)0x0,"compression-level","1");
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĝ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_set_filter_option(a, NULL, \"compression-level\", \"1\")"
                            ,paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,(size_t *)&r);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ĝ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used3)",paVar4);
        a = (archive *)archive_entry_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ğ',(uint)((archive_entry *)a != (archive_entry *)0x0),
                         "(ae = archive_entry_new()) != NULL",(void *)0x0);
        archive_entry_set_filetype((archive_entry *)a,0x8000);
        archive_entry_set_size((archive_entry *)a,path._8_8_);
        for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
          snprintf((char *)&used1,0x10,"file%03d");
          archive_entry_copy_pathname((archive_entry *)a,(char *)&used1);
          iVar2 = archive_write_header(paVar4,(archive_entry *)a);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĥ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_header(a, ae)",paVar4
                             );
          uVar1 = path._8_8_;
          lVar6 = archive_write_data(paVar4,__s,path._8_8_);
          assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                           ,L'ĥ',(uint)(uVar1 == lVar6),
                           "datasize == (size_t)archive_write_data(a, data, datasize)",paVar4);
        }
        archive_entry_free((archive_entry *)a);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĩ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ĩ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_read_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ī',(uint)(paVar4 != (archive *)0x0),"(a = archive_read_new()) != NULL",
                         (void *)0x0);
        iVar2 = archive_read_support_format_all(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ĭ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_format_all(a)",
                            paVar4);
        iVar2 = archive_read_support_filter_zstd(paVar4);
        if (iVar2 == -0x14) {
          skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'į');
          test_skipping("zstd reading not fully supported on this platform");
        }
        else {
          iVar2 = archive_read_support_filter_all(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĳ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_support_filter_all(a)"
                              ,paVar4);
          iVar2 = archive_read_open_memory(paVar4,buff_00,_r);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'Ĵ',0,"ARCHIVE_OK",(long)iVar2,
                              "archive_read_open_memory(a, buff, used3)",paVar4);
          for (local_64 = 0; (int)local_64 < 100; local_64 = local_64 + 1) {
            snprintf((char *)&used1,0x10,"file%03d");
            failure("Trying to read %s",&used1);
            iVar2 = archive_read_next_header(paVar4,(archive_entry **)&a);
            wVar3 = assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                        ,L'Ĺ',0,"ARCHIVE_OK",(long)iVar2,
                                        "archive_read_next_header(a, &ae)",paVar4);
            if (wVar3 == L'\0') break;
            pcVar5 = archive_entry_pathname((archive_entry *)a);
            assertion_equal_string
                      ("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L'Ļ',(char *)&used1,"path",pcVar5,"archive_entry_pathname(ae)",(void *)0x0,
                       L'\0');
            iVar2 = (int)path._8_8_;
            lVar7 = archive_entry_size((archive_entry *)a);
            assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                                ,L'ļ',(long)iVar2,"(int)datasize",lVar7,"archive_entry_size(ae)",
                                (void *)0x0);
          }
          iVar2 = archive_read_close(paVar4);
          assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                              ,L'ľ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_close(a)",paVar4);
        }
        iVar2 = archive_read_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŀ',0,"ARCHIVE_OK",(long)iVar2,"archive_read_free(a)",(void *)0x0);
        failure("compression-level=7 wrote %d bytes, default wrote %d bytes",used3 & 0xffffffff,
                used2 & 0xffffffff);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ň',(uint)(used3 < used2),"used2 < used1",(void *)0x0);
        failure("compression-level=1 wrote %d bytes, default wrote %d bytes",_r & 0xffffffff,
                used2 & 0xffffffff);
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ŋ',(uint)(used2 < _r),"used1 < used3",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ő',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Œ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'œ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'ŕ',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ŗ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŗ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ř',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Ś',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ś',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ŝ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ŝ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ş',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        paVar4 = archive_write_new();
        assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                         ,L'Š',(uint)(paVar4 != (archive *)0x0),"(a = archive_write_new()) != NULL"
                         ,(void *)0x0);
        iVar2 = archive_write_set_format_ustar(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'š',0,"ARCHIVE_OK",(long)iVar2,"archive_write_set_format_ustar(a)",
                            paVar4);
        iVar2 = archive_write_add_filter_zstd(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ţ',0,"ARCHIVE_OK",(long)iVar2,"archive_write_add_filter_zstd(a)",
                            paVar4);
        iVar2 = archive_write_open_memory(paVar4,buff_00,2000000,&used3);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ţ',0,"ARCHIVE_OK",(long)iVar2,
                            "archive_write_open_memory(a, buff, buffsize, &used2)",paVar4);
        iVar2 = archive_write_close(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'Ť',0,"ARCHIVE_OK",(long)iVar2,"archive_write_close(a)",(void *)0x0);
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'ť',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        free(__s);
        free(buff_00);
      }
      else {
        skipping_setup("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                       ,L';');
        test_skipping("zstd writing not supported on this platform");
        iVar2 = archive_write_free(paVar4);
        assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/Tarsnap[P]libarchive/libarchive/test/test_write_filter_zstd.c"
                            ,L'<',0,"ARCHIVE_OK",(long)iVar2,"archive_write_free(a)",(void *)0x0);
        free(buff_00);
        free(__s);
      }
    }
  }
  return;
}

Assistant:

DEFINE_TEST(test_write_filter_zstd)
{
	struct archive_entry *ae;
	struct archive *a;
	char *buff, *data;
	size_t buffsize, datasize;
	char path[16];
	size_t used1, used2, used3;
	int i, r;

	buffsize = 2000000;
	assert(NULL != (buff = malloc(buffsize)));
	if (buff == NULL)
		return;

	datasize = 10000;
	assert(NULL != (data = malloc(datasize)));
	if (data == NULL) {
		free(buff);
		return;
	}
	memset(data, 0, datasize);

	/*
	 * Write a 100 files and read them all back.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	r = archive_write_add_filter_zstd(a);
	if (r != ARCHIVE_OK) {
		skipping("zstd writing not supported on this platform");
		assertEqualInt(ARCHIVE_OK, archive_write_free(a));
		free(buff);
		free(data);
		return;
	}
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualInt(ARCHIVE_FILTER_ZSTD, archive_filter_code(a, 0));
	assertEqualString("zstd", archive_filter_name(a, 0));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used1));
	assertEqualInt(ARCHIVE_FILTER_ZSTD, archive_filter_code(a, 0));
	assertEqualString("zstd", archive_filter_name(a, 0));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize
		    == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("Can't verify zstd writing by reading back;"
		    " zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used1));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			if (!assertEqualInt(ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Repeat the cycle again, this time setting some compression
	 * options.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "nonexistent-option", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "abc"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "compression-level", "25")); /* too big */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "9"));
	/* Following is disabled as it will fail on library versions < 1.3.4 */
	/* assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "-1")); */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "7"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "threads", "-1")); /* negative */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "threads", "4"));
#if HAVE_ZSTD_H && HAVE_ZSTD_compressStream
	/* frame-per-file: boolean */
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "frame-per-file", ""));
	/* min-frame-in: >= 0 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "-1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-out", "1GB"));
	/* min-frame-out: >= 0 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "-1"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "0"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "min-frame-in", "1GB"));
	/* max-frame-in: >= 1024 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "-1"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1023"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1024"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-in", "1GB"));
	/* max-frame-out: >= 1024 */
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", ""));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "-1"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "0"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1023"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1024"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1048576"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1k"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1kB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1M"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1MB"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1G"));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "max-frame-out", "1GB"));
#endif
#if ZSTD_VERSION_NUMBER >= MINVER_LONG
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "long", "23"));
	assertEqualIntA(a, ARCHIVE_FAILED,
	    archive_write_set_filter_option(a, NULL, "long", "-1")); /* negative */
#endif
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		assert((ae = archive_entry_new()) != NULL);
		archive_entry_copy_pathname(ae, path);
		archive_entry_set_size(ae, datasize);
		archive_entry_set_filetype(ae, AE_IFREG);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
		archive_entry_free(ae);
	}
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used2));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * One more time at level 1
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_bytes_per_block(a, 10));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_OK,
	    archive_write_set_filter_option(a, NULL, "compression-level", "1"));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used3));
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_set_filetype(ae, AE_IFREG);
	archive_entry_set_size(ae, datasize);
	for (i = 0; i < 100; i++) {
		snprintf(path, sizeof(path), "file%03d", i);
		archive_entry_copy_pathname(ae, path);
		assertEqualIntA(a, ARCHIVE_OK, archive_write_header(a, ae));
		assertA(datasize == (size_t)archive_write_data(a, data, datasize));
	}
	archive_entry_free(ae);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_read_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_read_support_format_all(a));
	r = archive_read_support_filter_zstd(a);
	if (r == ARCHIVE_WARN) {
		skipping("zstd reading not fully supported on this platform");
	} else {
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_support_filter_all(a));
		assertEqualIntA(a, ARCHIVE_OK,
		    archive_read_open_memory(a, buff, used3));
		for (i = 0; i < 100; i++) {
			snprintf(path, sizeof(path), "file%03d", i);
			failure("Trying to read %s", path);
			if (!assertEqualIntA(a, ARCHIVE_OK,
				archive_read_next_header(a, &ae)))
				break;
			assertEqualString(path, archive_entry_pathname(ae));
			assertEqualInt((int)datasize, archive_entry_size(ae));
		}
		assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
	}
	assertEqualInt(ARCHIVE_OK, archive_read_free(a));

	/*
	 * Check output sizes for various compression levels, expectation
	 * is that archive size for level=7 < default < level=1
	 */
	failure("compression-level=7 wrote %d bytes, default wrote %d bytes",
	    (int)used2, (int)used1);
	assert(used2 < used1);
	failure("compression-level=1 wrote %d bytes, default wrote %d bytes",
	    (int)used3, (int)used1);
	assert(used1 < used3);

	/*
	 * Test various premature shutdown scenarios to make sure we
	 * don't crash or leak memory.
	 */
	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	assert((a = archive_write_new()) != NULL);
	assertEqualIntA(a, ARCHIVE_OK, archive_write_set_format_ustar(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_add_filter_zstd(a));
	assertEqualIntA(a, ARCHIVE_OK, archive_write_open_memory(a, buff, buffsize, &used2));
	assertEqualInt(ARCHIVE_OK, archive_write_close(a));
	assertEqualInt(ARCHIVE_OK, archive_write_free(a));

	/*
	 * Clean up.
	 */
	free(data);
	free(buff);
}